

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::ProcessAddressField(HdlcAnalyzer *this,HdlcByte byteAfterFlag)

{
  byte bVar1;
  Frame frame;
  U64 local_58;
  HdlcByte local_48;
  
  if (this->mAbortFrame == false) {
    if (((this->mSettings)._M_ptr)->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD) {
      Frame::Frame(&frame);
      _frame = byteAfterFlag.startSample;
      std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)_frame,(Channel *)0x8);
      Frame::~Frame(&frame);
    }
    else {
      local_58 = byteAfterFlag.startSample;
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,(MarkerType)byteAfterFlag.startSample,
                 (Channel *)0x8);
      do {
        Frame::Frame(&frame);
        _frame = local_58;
        std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
        if ((byteAfterFlag.value & 1) == 0) {
          bVar1 = 0;
        }
        else {
          ReadByte(&local_48,this);
          local_58 = local_48.startSample;
          bVar1 = this->mAbortFrame ^ 1;
          byteAfterFlag.value = local_48.value;
        }
        Frame::~Frame(&frame);
      } while (bVar1 != 0);
    }
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessAddressField( HdlcByte byteAfterFlag )
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
    {
        U8 flag = ( byteAfterFlag.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame =
            CreateFrame( HDLC_FIELD_BASIC_ADDRESS, byteAfterFlag.startSample, byteAfterFlag.endSample, byteAfterFlag.value, 0, flag );
        AddFrameToResults( frame );

        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( frame.mStartingSampleInclusive, AnalyzerResults::Start, mSettings->mInputChannel );
    }
    else // HDLC_EXTENDED_ADDRESS_FIELD
    {
        int i = 0;
        HdlcByte addressByte = byteAfterFlag;
        // Put a marker in the beggining of the HDLC frame
        mResults->AddMarker( addressByte.startSample, AnalyzerResults::Start, mSettings->mInputChannel );
        for( ;; )
        {
            U8 flag = ( addressByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
            Frame frame =
                CreateFrame( HDLC_FIELD_EXTENDED_ADDRESS, addressByte.startSample, addressByte.endSample, addressByte.value, i++, flag );
            AddFrameToResults( frame );

            U8 lsbBit = addressByte.value & 0x01;
            if( !lsbBit ) // End of Extended Address Field?
            {
                return;
            }

            // Next address byte
            addressByte = ReadByte();
            if( mAbortFrame )
            {
                return;
            }
        }
    }
}